

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

void __thiscall
glslang::TBuiltInIdTraverser::visitSymbol(TBuiltInIdTraverser *this,TIntermSymbol *symbol)

{
  int iVar1;
  undefined4 extraout_var;
  TType *this_00;
  mapped_type_conflict1 mVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
  *this_01;
  TString *__k;
  mapped_type_conflict1 *pmVar3;
  ulong uVar4;
  unsigned_long_long *puVar5;
  ulong local_38;
  ulong local_30;
  TShaderInterface local_24;
  long lStack_20;
  TShaderInterface si;
  TQualifier *qualifier;
  TIntermSymbol *symbol_local;
  TBuiltInIdTraverser *this_local;
  
  qualifier = (TQualifier *)symbol;
  symbol_local = (TIntermSymbol *)this;
  iVar1 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  lStack_20 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))();
  if ((*(ulong *)(lStack_20 + 8) >> 7 & 0x1ff) != 0) {
    this_00 = (TType *)(**(code **)(qualifier->semanticName + 0xf0))();
    local_24 = TType::getShaderInterface(this_00);
    mVar2 = (**(code **)(qualifier->semanticName + 0x180))();
    this_01 = &TIdMaps::operator[][abi_cxx11_(this->idMaps,(ulong)local_24)->
               super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
    ;
    __k = getNameForIdMap_abi_cxx11_((TIntermSymbol *)qualifier);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
             ::operator[](this_01,__k);
    *pmVar3 = mVar2;
  }
  uVar4 = (**(code **)(qualifier->semanticName + 0x180))();
  local_30 = this->idShift & 0xffffffffffffff;
  local_38 = (**(code **)(qualifier->semanticName + 0x180))();
  local_38 = local_38 & 0xffffffffffffff;
  puVar5 = std::max<unsigned_long_long>(&local_30,&local_38);
  this->idShift = uVar4 & 0xff00000000000000 | *puVar5;
  return;
}

Assistant:

virtual void visitSymbol(TIntermSymbol* symbol)
    {
        const TQualifier& qualifier = symbol->getType().getQualifier();
        if (qualifier.builtIn != EbvNone) {
            TShaderInterface si = symbol->getType().getShaderInterface();
            idMaps[si][getNameForIdMap(symbol)] = symbol->getId();
        }
        idShift = (symbol->getId() & ~TSymbolTable::uniqueIdMask) |
                std::max(idShift & TSymbolTable::uniqueIdMask,
                         symbol->getId() & TSymbolTable::uniqueIdMask);
    }